

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  size_t *psVar1;
  uint uVar2;
  StringPtr *pSVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  size_t extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  HashBucket *s;
  HashBucket *pHVar9;
  long lVar10;
  ulong targetSize;
  undefined4 in_register_00000084;
  size_t sVar11;
  HashBucket *pHVar12;
  Maybe<unsigned_long> MVar13;
  StringPtr str;
  StringPtr a;
  StringPtr b;
  bool local_99;
  Impl<0UL,_false> *local_98;
  char *local_90;
  StringHasher *local_88;
  InsertionOrderIndex *local_80;
  size_t local_78;
  StringPtr *local_70;
  size_t local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_table_h:478:5)>
  local_60;
  
  sVar11 = CONCAT44(in_register_00000084,skip);
  if (skip != 0) {
    pSVar3 = (table->rows).builder.ptr;
    lVar10 = (long)(table->rows).builder.pos - (long)pSVar3;
    local_88 = (StringHasher *)(row->content).ptr;
    local_90 = (char *)(row->content).size_;
    uVar4 = (table->indexes).buckets.size_ * 2;
    sVar8 = (lVar10 >> 4) + (table->indexes).erasedCount;
    local_98 = this;
    local_78 = pos;
    local_70 = row;
    local_68 = pos;
    if (uVar4 < sVar8 * 3 + 3) {
      targetSize = (lVar10 >> 3) + 2;
      if (targetSize < uVar4) {
        targetSize = uVar4;
      }
      HashIndex<kj::_::(anonymous_namespace)::StringHasher>::rehash(&table->indexes,targetSize);
      sVar8 = extraout_RDX;
    }
    str.content.size_ = sVar8;
    str.content.ptr = local_90;
    local_80 = (InsertionOrderIndex *)&table->indexes;
    uVar6 = _::anon_unknown_0::StringHasher::hashCode(local_88,str);
    uVar7 = _::chooseBucket(uVar6,(uint)(table->indexes).buckets.size_);
    pHVar9 = (HashBucket *)0x0;
LAB_00151f68:
    this = local_98;
    pHVar12 = (table->indexes).buckets.ptr + uVar7;
    uVar2 = pHVar12->value;
    if (uVar2 == 1) {
      if (pHVar9 == (HashBucket *)0x0) {
        pHVar9 = pHVar12;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar9 != (HashBucket *)0x0) {
          psVar1 = &(table->indexes).erasedCount;
          *psVar1 = *psVar1 - 1;
          pHVar12 = pHVar9;
        }
        *pHVar12 = (HashBucket)(((ulong)uVar6 | local_78 << 0x20) + 0x200000000);
        local_60.func.success = &local_99;
        local_60.func.indexObj = local_80;
        local_60.func.pos = &local_68;
        local_60.func.row = local_70;
        local_60.canceled = false;
        *local_98 = (Impl<0UL,_false>)0x0;
        local_99 = true;
        local_60.func.table = (Table<unsigned_int,_kj::InsertionOrderIndex> *)table;
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.h:478:5)>
        ::~Deferred(&local_60);
        pos = (size_t)extraout_RDX_01;
        goto LAB_0015204d;
      }
      if (pHVar12->hash == uVar6) {
        a.content.size_ = (size_t)local_88;
        a.content.ptr = (char *)pSVar3[uVar2 - 2].content.size_;
        b.content.size_ = sVar11;
        b.content.ptr = local_90;
        bVar5 = _::anon_unknown_0::StringHasher::matches
                          ((StringHasher *)pSVar3[uVar2 - 2].content.ptr,a,b);
        if (bVar5) goto LAB_00152039;
      }
    }
    sVar8 = (ulong)uVar7 + 1;
    uVar7 = 0;
    if (sVar8 != (table->indexes).buckets.size_) {
      uVar7 = (uint)sVar8;
    }
    goto LAB_00151f68;
  }
  *this = (Impl<0UL,_false>)0x0;
LAB_0015204d:
  MVar13.ptr.field_1.value = pos;
  MVar13.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar13.ptr;
LAB_00152039:
  uVar6 = pHVar12->value;
  *local_98 = (Impl<0UL,_false>)0x1;
  *(ulong *)(local_98 + 8) = (ulong)(uVar6 - 2);
  pos = (size_t)extraout_RDX_00;
  this = local_98;
  goto LAB_0015204d;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }